

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool_task.cpp
# Opt level: O0

void __thiscall
Function_Pool::FunctionPoolTask::_setup
          (FunctionPoolTask *this,Image *in1,uint32_t startX1,uint32_t startY1,Image *in2,
          uint32_t startX2,uint32_t startY2,uint32_t width,uint32_t height)

{
  bool bVar1;
  uint32_t height_;
  uint32_t uVar2;
  undefined8 uVar3;
  AbstractTaskProvider *in_RDI;
  uint32_t in_R8D;
  uint32_t in_stack_00000018;
  uint32_t in_stack_ffffffffffffff3c;
  uint32_t in_stack_ffffffffffffff44;
  Image *in_stack_ffffffffffffff48;
  InputImageInfo *in_stack_ffffffffffffff50;
  InputImageInfo *this_00;
  undefined8 in_stack_ffffffffffffff58;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff60;
  uint32_t in_stack_ffffffffffffff68;
  uint32_t in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint32_t in_stack_ffffffffffffff80;
  uint32_t in_stack_ffffffffffffff88;
  uint32_t local_20;
  
  local_20 = in_R8D;
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff6c
             ,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
             (uint32_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff58,in_stack_ffffffffffffff80,in_stack_ffffffffffffff88
            );
  uVar2 = (uint32_t)in_stack_ffffffffffffff60;
  bVar1 = AbstractTaskProvider::_ready(in_RDI);
  if (!bVar1) {
    uVar3 = __cxa_allocate_exception(0x28);
    imageException::imageException
              ((imageException *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    __cxa_throw(uVar3,&imageException::typeinfo,imageException::~imageException);
  }
  operator_new(0x68);
  height_ = anon_unknown.dwarf_899bb::threadCount();
  InputImageInfo::InputImageInfo
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
             in_stack_00000018,in_stack_ffffffffffffff3c,height_,uVar2);
  this_00 = (InputImageInfo *)&stack0xffffffffffffffc0;
  std::unique_ptr<Function_Pool::InputImageInfo,std::default_delete<Function_Pool::InputImageInfo>>
  ::unique_ptr<std::default_delete<Function_Pool::InputImageInfo>,void>
            ((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
              *)CONCAT44(in_stack_ffffffffffffff44,in_stack_00000018),
             (pointer)CONCAT44(in_stack_ffffffffffffff3c,height_));
  std::
  unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
  operator=((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             *)CONCAT44(in_stack_ffffffffffffff44,in_stack_00000018),
            (unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             *)CONCAT44(in_stack_ffffffffffffff3c,height_));
  std::
  unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
  ~unique_ptr((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
               *)CONCAT44(in_stack_ffffffffffffff44,in_stack_00000018));
  operator_new(0x68);
  uVar2 = anon_unknown.dwarf_899bb::threadCount();
  InputImageInfo::InputImageInfo
            (this_00,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_00000018,
             in_stack_ffffffffffffff3c,uVar2,local_20);
  std::unique_ptr<Function_Pool::InputImageInfo,std::default_delete<Function_Pool::InputImageInfo>>
  ::unique_ptr<std::default_delete<Function_Pool::InputImageInfo>,void>
            ((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
              *)CONCAT44(in_stack_ffffffffffffff44,in_stack_00000018),
             (pointer)CONCAT44(in_stack_ffffffffffffff3c,uVar2));
  std::
  unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
  operator=((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             *)CONCAT44(in_stack_ffffffffffffff44,in_stack_00000018),
            (unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             *)CONCAT44(in_stack_ffffffffffffff3c,uVar2));
  std::
  unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
  ~unique_ptr((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
               *)CONCAT44(in_stack_ffffffffffffff44,in_stack_00000018));
  return;
}

Assistant:

void FunctionPoolTask::_setup( const Image & in1, uint32_t startX1, uint32_t startY1, const Image & in2, uint32_t startX2, uint32_t startY2,
                 uint32_t width, uint32_t height )
    {
        Image_Function::ParameterValidation( in1, startX1, startY1, in2, startX2, startY2, width, height );

        if( !_ready() )
            throw imageException( "FunctionTask object was called multiple times!" );

        _infoIn1 = std::unique_ptr < InputImageInfo  >( new InputImageInfo ( in1, startX1, startY1, width, height, threadCount() ) );
        _infoIn2 = std::unique_ptr < InputImageInfo  >( new InputImageInfo ( in2, startX2, startY2, width, height, threadCount() ) );
    }